

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveGeneration.h
# Opt level: O3

MoveList * __thiscall
libchess::Position::legal_move_list(MoveList *__return_storage_ptr__,Position *this,Color stm)

{
  pointer pMVar1;
  Move move;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  Bitboard BVar5;
  pointer pMVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  pointer pMVar10;
  PieceType pt;
  long lVar11;
  ulong uVar12;
  
  uVar7 = this->color_bb_[0].value_;
  uVar4 = this->piece_type_bb_[5].value_ &
          this->color_bb_[(int)stm.super_MetaValueType<int>.value_].value_;
  lVar2 = 0;
  if (uVar4 != 0) {
    for (; (uVar4 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
    }
  }
  uVar4 = this->color_bb_[1].value_;
  uVar8 = (uVar7 & (&DAT_001405a0)[lVar2] | uVar4 & (&lookups::PAWN_ATTACKS)[lVar2]) &
          this->piece_type_bb_[0].value_;
  lVar11 = 1;
  do {
    BVar5 = lookups::non_pawn_piece_type_attacks
                      ((MetaValueType<int>)(value_type)lVar11,(MetaValueType<int>)(value_type)lVar2,
                       (Bitboard)(uVar4 | uVar7));
    uVar8 = uVar8 | BVar5.value_ & this->piece_type_bb_[lVar11].value_;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 6);
  if ((this->color_bb_[stm.super_MetaValueType<int>.value_ == 0].value_ & uVar8) == 0) {
    pseudo_legal_move_list(__return_storage_ptr__,this);
  }
  else {
    check_evasion_move_list
              (__return_storage_ptr__,this,
               (Color)(this->side_to_move_).super_MetaValueType<int>.value_);
  }
  uVar7 = this->color_bb_[(int)stm.super_MetaValueType<int>.value_].value_;
  uVar4 = this->piece_type_bb_[5].value_ & uVar7;
  lVar2 = 0;
  if (uVar4 != 0) {
    for (; (uVar4 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
    }
  }
  uVar4 = this->piece_type_bb_[4].value_;
  uVar8 = (ulong)(uint)((int)lVar2 << 3);
  uVar4 = ((uVar4 | this->piece_type_bb_[2].value_) &
           *(ulong *)((long)&lookups::BISHOP_ATTACKS + uVar8) |
          (this->piece_type_bb_[3].value_ | uVar4) &
          *(ulong *)((long)&lookups::ROOK_ATTACKS + uVar8)) &
          this->color_bb_[stm.super_MetaValueType<int>.value_ == 0].value_;
  if (uVar4 == 0) {
    uVar12 = 0;
  }
  else {
    uVar12 = 0;
    do {
      lVar2 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      uVar9 = *(ulong *)(lookups::INTERVENING + (uint)((int)lVar2 << 9) + uVar8) &
              (this->color_bb_[1].value_ | this->color_bb_[0].value_);
      if (uVar9 - 1 < (uVar9 ^ uVar9 - 1)) {
        uVar9 = uVar9 & uVar7;
      }
      else {
        uVar9 = 0;
      }
      uVar12 = uVar12 ^ uVar9;
      uVar4 = uVar4 & uVar4 - 1;
    } while (uVar4 != 0);
  }
  pMVar10 = (__return_storage_ptr__->values_).
            super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
            super__Vector_impl_data._M_start;
  pMVar6 = (__return_storage_ptr__->values_).
           super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    while( true ) {
      if (pMVar10 == pMVar6) {
        return __return_storage_ptr__;
      }
      move.value_ = pMVar10->value_;
      if (((uVar12 >> (move.value_ & 0x3fU) & 1) != 0) || ((move.value_ & 0x38000U) == 0x18000))
      break;
      uVar7 = this->piece_type_bb_[5].value_ &
              this->color_bb_[(int)stm.super_MetaValueType<int>.value_].value_;
      lVar2 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      if ((move.value_ & 0x3fU) == (uint)lVar2) break;
LAB_00115e9d:
      pMVar10 = pMVar10 + 1;
    }
    bVar3 = is_legal_generated_move(this,move);
    pMVar6 = (__return_storage_ptr__->values_).
             super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (bVar3) goto LAB_00115e9d;
    pMVar1 = pMVar6 + -1;
    pMVar6 = pMVar6 + -1;
    pMVar10->value_ = pMVar1->value_;
    (__return_storage_ptr__->values_).
    super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
    super__Vector_impl_data._M_finish = pMVar6;
  } while( true );
}

Assistant:

inline MoveList Position::legal_move_list(Color stm) const {
    MoveList move_list = checkers_to(stm) ? check_evasion_move_list() : pseudo_legal_move_list();
    Bitboard pinned = pinned_pieces_of(stm);
    for (auto move = move_list.begin(); move != move_list.end();) {
        if (((pinned & Bitboard{move->from_square()}) || move->from_square() == king_square(stm) ||
             move->type() == Move::Type::ENPASSANT) &&
            !is_legal_generated_move(*move)) {
            *move = *(move_list.end() - 1);
            move_list.pop_back();
        } else {
            ++move;
        }
    }
    return move_list;
}